

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

vector<User,_std::allocator<User>_> * getUsers(void)

{
  anon_struct_64_2_84df61a8 *__args;
  char cVar1;
  istream *piVar2;
  vector<User,_std::allocator<User>_> *in_RDI;
  long local_2a0;
  ifstream myfile;
  size_type *local_98;
  string line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 uStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<User,_std::allocator<User>_> *local_38;
  
  local_98 = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38 = in_RDI;
  std::ifstream::ifstream((istream *)&local_2a0,"../users.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cerr,"couldn\'t open file");
    exit(-1);
  }
  __args = (anon_struct_64_2_84df61a8 *)(&line.field_2._M_allocated_capacity + 1);
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_2a0 + -0x18) + (char)(istream *)&local_2a0);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_2a0,(string *)&local_98,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find((char *)&local_98,0x10932c,0);
    local_68._8_8_ = 0;
    local_48._8_8_ = 0;
    line.field_2._8_8_ = &local_68;
    local_68._M_allocated_capacity = 0;
    uStack_50 = 0;
    local_48._M_allocated_capacity = 0;
    local_58 = &local_48;
    std::vector<User,_std::allocator<User>_>::emplace_back<User>(local_38,__args);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line.field_2._8_8_ != &local_68) {
      operator_delete((void *)line.field_2._8_8_);
    }
    std::__cxx11::string::substr((ulong)__args,(ulong)&local_98);
    std::__cxx11::string::operator=
              ((string *)
               ((local_38->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
                super__Vector_impl_data._M_finish + -1),(string *)__args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line.field_2._8_8_ != &local_68) {
      operator_delete((void *)line.field_2._8_8_);
    }
    std::__cxx11::string::substr((ulong)__args,(ulong)&local_98);
    std::__cxx11::string::operator=
              ((string *)
               &(local_38->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
                super__Vector_impl_data._M_finish[-1].password,(string *)__args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line.field_2._8_8_ != &local_68) {
      operator_delete((void *)line.field_2._8_8_);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_2a0);
  if (local_98 != &line._M_string_length) {
    operator_delete(local_98);
  }
  return local_38;
}

Assistant:

vector<User> getUsers(){
    string line;
    vector<User> users;
    ifstream myfile ("../users.txt");

    if(myfile.is_open()){
        while(getline(myfile,line)){

            //get pos of comma
            int commaPos = line.find(",");

            users.push_back(User());
            //username if everything before comma and after (
            users.back().username = line.substr(1,commaPos-1);
            //password is evertyhign after the comma and space and before the )
            users.back().password = line.substr(commaPos+2,line.length() - commaPos - 3);
        }
        myfile.close();
    }
    else{
        cerr << "couldn't open file";
        exit(-1);
    }


    return users;
}